

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_fpcall2(jit_State *J)

{
  uint64_t u64;
  double y;
  double b;
  double a;
  CCallInfo *ci;
  jit_State *J_local;
  TValue tv;
  
  if (((J->fold).left[0].field_0.op1 < 0x8000) && ((J->fold).left[0].field_0.op2 < 0x8000)) {
    u64 = (*lj_ir_callinfo[(J->fold).ins.field_0.op2].func)
                    ((J->cur).ir[(ulong)(J->fold).left[0].field_0.op1 + 1],
                     (J->cur).ir[(ulong)(J->fold).left[0].field_0.op2 + 1]);
    J_local._4_4_ = lj_ir_knum_u64(J,u64);
  }
  else {
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(CALLN CARG IRCALL_atan2)
LJFOLDF(kfold_fpcall2)
{
  if (irref_isk(fleft->op1) && irref_isk(fleft->op2)) {
    const CCallInfo *ci = &lj_ir_callinfo[fins->op2];
    double a = ir_knum(IR(fleft->op1))->n;
    double b = ir_knum(IR(fleft->op2))->n;
    double y = ((double (*)(double, double))ci->func)(a, b);
    return lj_ir_knum(J, y);
  }
  return NEXTFOLD;
}